

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analog.cpp
# Opt level: O0

void __thiscall E64::analog_ic::write_byte(analog_ic *this,uint8_t address,uint8_t byte)

{
  byte in_DL;
  undefined1 in_SIL;
  analog_ic *in_RDI;
  
  switch(in_SIL) {
  case 0:
    in_RDI->waveform = (int)(uint)in_DL >> 4;
    if ((in_DL & 1) == 0) {
      in_RDI->gate_open = false;
    }
    else {
      in_RDI->gate_open = true;
    }
    if ((in_DL & 2) == 0) {
      in_RDI->pitch_bend_on = false;
    }
    else {
      in_RDI->pitch_bend_on = true;
    }
    if ((in_DL & 4) == 0) {
      in_RDI->pitch_up = false;
    }
    else {
      in_RDI->pitch_up = true;
    }
    break;
  case 1:
    in_RDI->pitch_factor = in_DL;
    break;
  case 2:
    in_RDI->digital_freq = (ushort)in_DL << 8 | in_RDI->digital_freq & 0xff;
    set_frequency(in_RDI);
    break;
  case 3:
    in_RDI->digital_freq = in_RDI->digital_freq & 0xff00 | (ushort)in_DL;
    set_frequency(in_RDI);
    break;
  case 4:
    in_RDI->square_duty = (ushort)in_DL << 8 | in_RDI->square_duty & 0xff;
    break;
  case 5:
    in_RDI->square_duty = in_RDI->square_duty & 0xff00 | (ushort)in_DL;
    break;
  case 6:
    in_RDI->attack = (ushort)in_DL << 8 | in_RDI->attack & 0xff;
    break;
  case 7:
    in_RDI->attack = in_RDI->attack & 0xff00 | (ushort)in_DL;
    break;
  case 8:
    in_RDI->decay = (ushort)in_DL << 8 | in_RDI->decay & 0xff;
    break;
  case 9:
    in_RDI->decay = in_RDI->decay & 0xff00 | (ushort)in_DL;
    break;
  case 10:
    in_RDI->sustain = (ushort)in_DL << 8 | in_RDI->sustain & 0xff;
    break;
  case 0xb:
    in_RDI->sustain = in_RDI->sustain & 0xff00 | (ushort)in_DL;
    break;
  case 0xc:
    in_RDI->release = (ushort)in_DL << 8 | in_RDI->release & 0xff;
    break;
  case 0xd:
    in_RDI->release = in_RDI->release & 0xff00 | (ushort)in_DL;
    break;
  case 0xe:
    in_RDI->pitch_bend_duration = (ushort)in_DL << 8 | in_RDI->pitch_bend_duration & 0xff;
    break;
  case 0xf:
    in_RDI->pitch_bend_duration = in_RDI->pitch_bend_duration & 0xff00 | (ushort)in_DL;
  }
  return;
}

Assistant:

void E64::analog_ic::write_byte(uint8_t address, uint8_t byte) {
	switch (address) {
		case 0x00:
			// TODO: situation 5 6 and 7
			waveform = (enum waveforms)(byte >> 4);
			(byte & 0b00000001) ? gate_open = true : gate_open = false;
			(byte & 0b00000010) ? pitch_bend_on = true : pitch_bend_on = false;
			(byte & 0b00000100) ? pitch_up = true : pitch_up = false;
			break;
		case 0x01:
			//pitch_factor = byte ? byte : 1;
			pitch_factor = byte;
			break;
		case 0x02:
			digital_freq = (byte << 8) | (digital_freq & 0xff);
			set_frequency();
			break;
		case 0x03:
			digital_freq = (digital_freq & 0xff00) | byte;
			set_frequency();
			break;
		case 0x04:
			square_duty = (byte << 8) | (square_duty & 0xff);
			break;
		case 0x05:
			square_duty = (square_duty & 0xff00) | byte;
			break;
		case 0x06:
			attack = (byte << 8) | (attack & 0xff);
			break;
		case 0x07:
			attack = (attack & 0xff00) | byte;
			break;
		case 0x08:
			decay = (byte << 8) | (decay & 0xff);
			break;
		case 0x09:
			decay = (decay & 0xff00) | byte;
			break;
		case 0x0a:
			sustain = (byte << 8) | (sustain & 0xff);
			break;
		case 0x0b:
			sustain = (sustain & 0xff00) | byte;
			break;
		case 0x0c:
			release = (byte << 8) | (release & 0xff);
			break;
		case 0x0d:
			release = (release & 0xff00) | byte;
			break;
		case 0x0e:
			pitch_bend_duration = (byte << 8) | (pitch_bend_duration & 0xff);
			break;
		case 0x0f:
			pitch_bend_duration = (pitch_bend_duration & 0xff00) | byte;
			break;
	}
}